

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFoo(TestMoreStuffImpl *this,CallFooContext context)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  RequestHook *pRVar5;
  TransformPromiseNodeBase *this_00;
  _func_int **in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar6;
  int in_R8D;
  Promise<void> PVar7;
  Client cap;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  undefined1 local_f8 [16];
  CapTableBuilder *pCStack_e8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_e0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_a8;
  StructReader local_68;
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_e0);
  local_a8.super_Builder._builder.data = local_e0.super_Builder._builder.data;
  local_a8.super_Builder._builder.pointers = local_e0.super_Builder._builder.pointers;
  local_a8.super_Builder._builder.segment = local_e0.super_Builder._builder.segment;
  local_a8.super_Builder._builder.capTable = local_e0.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_68,(PointerReader *)&local_a8,(word *)0x0);
  if (local_68.pointerCount == 0) {
    local_68.nestingLimit = 0x7fffffff;
    local_68.segment = (SegmentReader *)0x0;
    local_68.pointers = (WirePointer *)0x0;
    local_68.capTable = (CapTableReader *)0x0;
  }
  local_a8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_a8.super_Builder._builder.pointers._4_4_,local_68.nestingLimit)
  ;
  local_a8.super_Builder._builder.segment = (SegmentBuilder *)local_68.segment;
  local_a8.super_Builder._builder.capTable = (CapTableBuilder *)local_68.capTable;
  local_a8.super_Builder._builder.data = local_68.pointers;
  PointerReader::getCapability((PointerReader *)&local_e0);
  local_f8._8_8_ = local_e0.super_Builder._builder.segment;
  pCStack_e8 = local_e0.super_Builder._builder.capTable;
  local_f8._0_8_ = &Capability::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_a8,(Client *)local_f8,&local_38);
  ((WireValue<uint32_t> *)local_a8.super_Builder._builder.data)->value = 0x7b;
  *(byte *)((long)local_a8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_a8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_e0,(int)&local_a8,__buf,(size_t)local_68.pointers,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_e0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1031:7),_kj::_::PropagateException>
             ::anon_class_8_1_bc11688f_for_func::operator());
  pDVar4 = local_e0.hook.disposer;
  uVar3 = local_e0.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00376120;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
  *(undefined8 **)&this->super_Server =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestMoreStuffImpl::callFoo(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar6 = extraout_RDX;
  if (local_e0.super_Builder._builder._32_8_ != 0) {
    local_e0.super_Builder._builder.dataSize = 0;
    local_e0.super_Builder._builder.pointerCount = 0;
    local_e0.super_Builder._builder._38_2_ = 0;
    local_e0.hook.disposer = (Disposer *)0x0;
    (**(local_e0.hook.ptr)->_vptr_RequestHook)(local_e0.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
    pPVar6 = extraout_RDX_00;
  }
  pWVar2 = local_e0.super_Builder._builder.pointers;
  if (local_e0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_e0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_e0.super_Builder._builder.data)
              (local_e0.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
    pPVar6 = extraout_RDX_01;
  }
  pCVar1 = local_e0.super_Builder._builder.capTable;
  if (local_e0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_e0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_e0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_e0.super_Builder._builder.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_02;
  }
  pRVar5 = local_a8.hook.ptr;
  if (local_a8.hook.ptr != (RequestHook *)0x0) {
    local_a8.hook.ptr = (RequestHook *)0x0;
    (**(local_a8.hook.disposer)->_vptr_Disposer)
              (local_a8.hook.disposer,
               pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    pPVar6 = extraout_RDX_03;
  }
  pCVar1 = pCStack_e8;
  if (pCStack_e8 != (CapTableBuilder *)0x0) {
    pCStack_e8 = (CapTableBuilder *)0x0;
    (*(code *)((SegmentReader *)local_f8._8_8_)->arena->_vptr_Arena)
              (local_f8._8_8_,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_04;
  }
  PVar7.super_PromiseBase.node.ptr = pPVar6;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFoo(CallFooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }